

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

SequenceFeatureType * __thiscall
CoreML::Specification::SequenceFeatureType::New(SequenceFeatureType *this,Arena *arena)

{
  SequenceFeatureType *this_00;
  
  this_00 = (SequenceFeatureType *)operator_new(0x28);
  SequenceFeatureType(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SequenceFeatureType>(arena,this_00);
  }
  return this_00;
}

Assistant:

SequenceFeatureType* SequenceFeatureType::New(::google::protobuf::Arena* arena) const {
  SequenceFeatureType* n = new SequenceFeatureType;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}